

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

int bf_rewind(bfile_t *bfile,uint n_bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __off;
  
  uVar1 = bfile->pos;
  uVar2 = uVar1 / bfile->buffer_size;
  if (uVar1 < n_bytes) {
    bfile->pos = 0;
    fwrite("warning: tried rewinding past beginning of file.\n",0x31,1,_stderr);
  }
  else {
    bfile->pos = uVar1 - n_bytes;
    uVar1 = (ulong)n_bytes;
  }
  uVar3 = bfile->pos / (ulong)bfile->buffer_size;
  if (uVar3 < uVar2) {
    __off = uVar3 * bfile->buffer_size;
    bfile->ipos = __off;
    fseek((FILE *)bfile->file,__off,0);
    bf_read_buffer(bfile);
  }
  return (int)uVar1;
}

Assistant:

int
bf_rewind(
    bfile_t * bfile,
    unsigned int n_bytes )
{
    size_t prevbuf, newbuf, num_bytes = n_bytes;
    assert( bfile != NULL );
    prevbuf = bfile->pos / bfile->buffer_size;
    if ( num_bytes > bfile->pos ) {
        num_bytes = bfile->pos;
        bfile->pos = 0;
        fprintf( stderr, "warning: tried rewinding past beginning of file.\n" );
    } else {
        bfile->pos -= num_bytes;
    }
    newbuf = bfile->pos / bfile->buffer_size;
    if ( newbuf < prevbuf ) { /* rewinded past block boundary */
        /* refresh "preloaded" buffer with old buffer */
        bfile->ipos = newbuf * bfile->buffer_size;
        fseek( bfile->file, (long)bfile->ipos, SEEK_SET );
        bf_read_buffer( bfile );
    }
    return (int)num_bytes;
}